

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void stats_print_atexit(void)

{
  arena_t *arena;
  tsd_t *tsd;
  ulong uVar1;
  ulong uVar2;
  tcache_t *tcache;
  char *in_FS_OFFSET;
  
  if (tsd_booted) {
    tsd = *(tsd_t **)in_FS_OFFSET;
    if (*in_FS_OFFSET != '\0') {
      tsd = tsd_fetch_slow(tsd,false);
    }
  }
  else {
    tsd = (tsd_t *)0x0;
  }
  uVar1 = (ulong)narenas_total.repr;
  for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    arena = (arena_t *)arenas[uVar2].repr;
    if (arena != (arena_t *)0x0) {
      malloc_mutex_lock((tsdn_t *)tsd,&arena->tcache_ql_mtx);
      tcache = (arena->tcache_ql).qlh_first;
      while (tcache != (tcache_t *)0x0) {
        tcache_stats_merge((tsdn_t *)tsd,tcache,arena);
        tcache = (tcache->link).qre_next;
        if (tcache == (arena->tcache_ql).qlh_first) {
          tcache = (tcache_t *)0x0;
        }
      }
      (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x40));
    }
  }
  je_malloc_stats_print((_func_void_void_ptr_char_ptr *)0x0,(void *)0x0,opt_stats_print_opts);
  return;
}

Assistant:

static void
stats_print_atexit(void) {
	if (config_stats) {
		tsdn_t *tsdn;
		unsigned narenas, i;

		tsdn = tsdn_fetch();

		/*
		 * Merge stats from extant threads.  This is racy, since
		 * individual threads do not lock when recording tcache stats
		 * events.  As a consequence, the final stats may be slightly
		 * out of date by the time they are reported, if other threads
		 * continue to allocate.
		 */
		for (i = 0, narenas = narenas_total_get(); i < narenas; i++) {
			arena_t *arena = arena_get(tsdn, i, false);
			if (arena != NULL) {
				tcache_t *tcache;

				malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
				ql_foreach(tcache, &arena->tcache_ql, link) {
					tcache_stats_merge(tsdn, tcache, arena);
				}
				malloc_mutex_unlock(tsdn,
				    &arena->tcache_ql_mtx);
			}
		}
	}
	je_malloc_stats_print(NULL, NULL, opt_stats_print_opts);
}